

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O2

void __thiscall
Assimp::SplitLargeMeshesProcess_Triangle::Execute
          (SplitLargeMeshesProcess_Triangle *this,aiScene *pScene)

{
  Logger *pLVar1;
  long lVar2;
  aiMesh **ppaVar3;
  uint a;
  ulong uVar4;
  pointer ppVar5;
  pointer ppVar6;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  avList;
  _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  local_38;
  
  if ((pScene != (aiScene *)0x0) && (this->LIMIT != 0xffffffff)) {
    pLVar1 = DefaultLogger::get();
    Logger::debug(pLVar1,"SplitLargeMeshesProcess_Triangle begin");
    local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar4 = 0; uVar4 < pScene->mNumMeshes; uVar4 = uVar4 + 1) {
      SplitMesh(this,(uint)uVar4,pScene->mMeshes[uVar4],
                (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                 *)&local_38);
    }
    lVar2 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
            (long)local_38._M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar2 >> 4;
    if (uVar4 == pScene->mNumMeshes) {
      pLVar1 = DefaultLogger::get();
      Logger::debug(pLVar1,"SplitLargeMeshesProcess_Triangle finished. There was nothing to do");
    }
    else {
      if (pScene->mMeshes != (aiMesh **)0x0) {
        operator_delete__(pScene->mMeshes);
        lVar2 = (long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start;
        uVar4 = lVar2 >> 4;
      }
      ppVar6 = local_38._M_impl.super__Vector_impl_data._M_finish;
      ppVar5 = local_38._M_impl.super__Vector_impl_data._M_start;
      pScene->mNumMeshes = (uint)uVar4;
      ppaVar3 = (aiMesh **)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | lVar2 >> 1);
      pScene->mMeshes = ppaVar3;
      for (uVar4 = 0; uVar4 < (ulong)((long)ppVar6 - (long)ppVar5 >> 4);
          uVar4 = (ulong)((int)uVar4 + 1)) {
        pScene->mMeshes[uVar4] = ppVar5[uVar4].first;
        ppVar5 = local_38._M_impl.super__Vector_impl_data._M_start;
        ppVar6 = local_38._M_impl.super__Vector_impl_data._M_finish;
      }
      UpdateNode(pScene->mRootNode,
                 (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                  *)&local_38);
      pLVar1 = DefaultLogger::get();
      Logger::info(pLVar1,"SplitLargeMeshesProcess_Triangle finished. Meshes have been split");
    }
    std::
    _Vector_base<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
    ::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::Execute( aiScene* pScene) {
    if (0xffffffff == this->LIMIT || nullptr == pScene ) {
        return;
    }

    ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Triangle begin");
    std::vector<std::pair<aiMesh*, unsigned int> > avList;

    for( unsigned int a = 0; a < pScene->mNumMeshes; ++a) {
        this->SplitMesh(a, pScene->mMeshes[a],avList);
    }

    if (avList.size() != pScene->mNumMeshes) {
        // it seems something has been split. rebuild the mesh list
        delete[] pScene->mMeshes;
        pScene->mNumMeshes = (unsigned int)avList.size();
        pScene->mMeshes = new aiMesh*[avList.size()];

        for (unsigned int i = 0; i < avList.size();++i) {
            pScene->mMeshes[i] = avList[i].first;
        }

        // now we need to update all nodes
        this->UpdateNode(pScene->mRootNode,avList);
        ASSIMP_LOG_INFO("SplitLargeMeshesProcess_Triangle finished. Meshes have been split");
    } else {
        ASSIMP_LOG_DEBUG("SplitLargeMeshesProcess_Triangle finished. There was nothing to do");
    }
}